

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk.c
# Opt level: O2

void hd_drop_disk(hd_context *ctx,hd_disk *disk)

{
  int iVar1;
  
  if (((disk != (hd_disk *)0x0) && (0 < disk->refs)) &&
     (iVar1 = disk->refs + -1, disk->refs = iVar1, iVar1 == 0)) {
    if (disk->drop_disk != (hd_disk_drop_fn *)0x0) {
      (*disk->drop_disk)(ctx,disk);
    }
    hd_drop_dest_disk(ctx,disk->disk_dest);
    hd_free(ctx,disk);
    return;
  }
  return;
}

Assistant:

void
hd_drop_disk(hd_context *ctx, hd_disk *disk)
{
    if (hd_drop_imp(ctx, disk, &disk->refs))
    {
        if (disk->drop_disk)
            disk->drop_disk(ctx, disk);
        hd_drop_dest_disk(ctx, disk->disk_dest);
        hd_free(ctx, disk);
    }
}